

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

DictUnit * __thiscall cppjieba::Trie::Find(Trie *this,const_iterator begin,const_iterator end)

{
  bool bVar1;
  pointer pvVar2;
  long in_RDX;
  long in_RSI;
  unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
  *in_RDI;
  const_iterator it;
  const_iterator citer;
  TrieNode *ptNode;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
  in_stack_ffffffffffffffb0;
  long local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_30;
  TrieNode *local_28;
  long local_20;
  long local_18;
  DictUnit *local_8;
  
  if (in_RSI == in_RDX) {
    local_8 = (DictUnit *)0x0;
  }
  else {
    local_28 = (TrieNode *)(in_RDI->_M_h)._M_buckets;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                *)0x1298ac);
    for (local_38 = local_18; local_38 != local_20; local_38 = local_38 + 0x14) {
      if (local_28->next == (NextMap *)0x0) {
        return (DictUnit *)0x0;
      }
      std::
      unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
      ::find(in_RDI,(key_type *)0x1298f2);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
      _Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)in_stack_ffffffffffffffb0._M_cur,
                 (_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                  *)in_RDI);
      in_stack_ffffffffffffffb0._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::end(in_RDI);
      bVar1 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                          *)&stack0xffffffffffffffb0,&local_30);
      if (bVar1) {
        return (DictUnit *)0x0;
      }
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                             *)0x12994c);
      local_28 = pvVar2->second;
    }
    local_8 = local_28->ptValue;
  }
  return local_8;
}

Assistant:

const DictUnit* Find(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    if (begin == end) {
      return NULL;
    }

    const TrieNode* ptNode = root_;
    TrieNode::NextMap::const_iterator citer;
    for (RuneStrArray::const_iterator it = begin; it != end; it++) {
      if (NULL == ptNode->next) {
        return NULL;
      }
      citer = ptNode->next->find(it->rune);
      if (ptNode->next->end() == citer) {
        return NULL;
      }
      ptNode = citer->second;
    }
    return ptNode->ptValue;
  }